

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O2

char * __thiscall google::protobuf::FastInt64ToBufferLeft(protobuf *this,int64 i,char *buffer)

{
  char *pcVar1;
  
  if ((long)this < 0) {
    *(undefined1 *)i = 0x2d;
    i = i + 1;
    this = (protobuf *)-(long)this;
  }
  pcVar1 = FastUInt64ToBufferLeft(this,i,buffer);
  return pcVar1;
}

Assistant:

char* FastInt64ToBufferLeft(int64 i, char* buffer) {
  uint64 u = 0;
  if (i < 0) {
    *buffer++ = '-';
    u -= i;
  } else {
    u = i;
  }
  return FastUInt64ToBufferLeft(u, buffer);
}